

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

Offset<reflection::Service> __thiscall
flatbuffers::ServiceDef::Serialize(ServiceDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  uoffset_t start;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  string *psVar1;
  pointer pcVar2;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>_> off;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> off_00;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> off_01;
  Offset<flatbuffers::String> off_02;
  Offset<reflection::Service> table;
  pointer ppRVar3;
  Offset<reflection::RPCCall> *v;
  vector<flatbuffers::Offset<reflection::RPCCall>,_std::allocator<flatbuffers::Offset<reflection::RPCCall>_>_>
  servicecall_offsets;
  string decl_file_in_project;
  string qualified_name;
  Offset<reflection::RPCCall> *local_98;
  iterator iStack_90;
  Offset<reflection::RPCCall> *local_88;
  Offset<flatbuffers::String> local_74;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  string local_50;
  
  local_98 = (Offset<reflection::RPCCall> *)0x0;
  iStack_90._M_current = (Offset<reflection::RPCCall> *)0x0;
  local_88 = (Offset<reflection::RPCCall> *)0x0;
  ppRVar3 = (this->calls).vec.
            super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar3 !=
      (this->calls).vec.
      super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_50._M_dataplus._M_p._0_4_ = RPCCall::Serialize(*ppRVar3,builder,parser);
      if (iStack_90._M_current == local_88) {
        std::
        vector<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>
        ::_M_realloc_insert<flatbuffers::Offset<reflection::RPCCall>>
                  ((vector<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>
                    *)&local_98,iStack_90,(Offset<reflection::RPCCall> *)&local_50);
      }
      else {
        (iStack_90._M_current)->o = local_50._M_dataplus._M_p._0_4_;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      ppRVar3 = ppRVar3 + 1;
    } while (ppRVar3 !=
             (this->calls).vec.
             super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  Namespace::GetFullyQualifiedName
            (&local_50,(this->super_Definition).defined_namespace,(string *)this,1000);
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (builder,(char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                      local_50._M_dataplus._M_p._0_4_),local_50._M_string_length);
  local_74.o = (builder->buf_).size_;
  v = (Offset<reflection::RPCCall> *)
      &data<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>(std::vector<flatbuffers::Offset<reflection::RPCCall>,std::allocator<flatbuffers::Offset<reflection::RPCCall>>>const&)
       ::t;
  if ((long)iStack_90._M_current - (long)local_98 != 0) {
    v = local_98;
  }
  off = FlatBufferBuilderImpl<false>::CreateVector<reflection::RPCCall>
                  (builder,v,(long)iStack_90._M_current - (long)local_98 >> 2);
  off_00 = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  off_01.o = 0;
  if ((parser->opts).binary_schema_comments == true) {
    begin._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    end._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    off_01.o = 0;
    if (begin._M_current != end._M_current) {
      off_01 = FlatBufferBuilderImpl<false>::
               CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (builder,begin,end);
    }
  }
  psVar1 = (this->super_Definition).declaration_file;
  local_70 = local_60;
  if (psVar1 == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  }
  else {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + psVar1->_M_string_length);
  }
  off_02 = FlatBufferBuilderImpl<false>::CreateSharedString(builder,(char *)local_70,local_68);
  FlatBufferBuilderImpl<false>::NotNested(builder);
  builder->nested = true;
  start = (builder->buf_).size_;
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(builder,0xc,off_02);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (builder,10,off_01);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>>
            (builder,8,off_00);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,unsigned_int>>
            (builder,6,off);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(builder,4,local_74);
  table.o = FlatBufferBuilderImpl<false>::EndTable(builder,start);
  FlatBufferBuilderImpl<false>::Required<reflection::Service>(builder,table,4);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != (Offset<reflection::RPCCall> *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return (Offset<reflection::Service>)table.o;
}

Assistant:

Offset<reflection::Service> ServiceDef::Serialize(FlatBufferBuilder *builder,
                                                  const Parser &parser) const {
  std::vector<Offset<reflection::RPCCall>> servicecall_offsets;
  for (auto it = calls.vec.begin(); it != calls.vec.end(); ++it) {
    servicecall_offsets.push_back((*it)->Serialize(builder, parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto call__ = builder->CreateVector(servicecall_offsets);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateService(*builder, name__, call__, attr__, docs__,
                                   file__);
}